

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O3

void __thiscall chrono::utils::ChChaseCamera::Update(ChChaseCamera *this,double step)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  ChVector<double> *in_RDX;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChVector<double> local_28;
  long lVar3;
  
  calcDeriv(&local_28,this,in_RDX);
  dVar1 = (this->m_loc).m_data[1];
  (this->m_loc).m_data[0] = step * local_28.m_data[0] + (this->m_loc).m_data[0];
  (this->m_loc).m_data[1] = step * local_28.m_data[1] + dVar1;
  (this->m_loc).m_data[2] = step * local_28.m_data[2] + (this->m_loc).m_data[2];
  if (this->m_state == Track) {
    iVar2 = (*(((this->m_chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])();
    lVar3 = CONCAT44(extraout_var,iVar2);
    dVar1 = *(double *)(lVar3 + 0x10) - (this->m_lastLoc).m_data[1];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(double *)(lVar3 + 8) - (this->m_lastLoc).m_data[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar1 * dVar1;
    auVar4 = vfmadd231sd_fma(auVar5,auVar4,auVar4);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(double *)(lVar3 + 0x18) - (this->m_lastLoc).m_data[2];
    auVar4 = vfmadd231sd_fma(auVar4,auVar6,auVar6);
    if (10000.0 < auVar4._0_8_) {
      if (this->m_state == Free) {
        this->m_mult = 1.0;
      }
      dVar1 = (this->m_loc).m_data[1];
      (this->m_lastLoc).m_data[0] = (this->m_loc).m_data[0];
      (this->m_lastLoc).m_data[1] = dVar1;
      (this->m_lastLoc).m_data[2] = (this->m_loc).m_data[2];
      this->m_state = Chase;
      this->m_angle = 0.0;
    }
  }
  return;
}

Assistant:

void ChChaseCamera::Update(double step) {
    // Perform a simple Euler integration step (derivative controller).
    m_loc += step * calcDeriv(m_loc);

    if (m_state != Track)
        return;

    // If in 'Track' mode, force a state change if too far from tracked body.
    double dist2 = (m_chassis->GetFrame_REF_to_abs().GetPos() - m_lastLoc).Length2();
    if (dist2 > m_maxTrackDist2)
        SetState(Chase);
}